

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

bool tinyusdz::detail::ParseMaterialXValue<tinyusdz::value::normal3f>
               (string *str,normal3f *value,string *err)

{
  bool bVar1;
  normal3f val;
  StreamReader sr;
  AsciiParser parser;
  normal3f local_518;
  StreamReader local_508;
  AsciiParser local_4e8;
  
  local_508.binary_ = (uint8_t *)(str->_M_dataplus)._M_p;
  local_508.length_ = str->_M_string_length;
  local_508.swap_endian_ = false;
  local_508.idx_ = 0;
  ascii::AsciiParser::AsciiParser(&local_4e8,&local_508);
  local_518.z = 0.0;
  local_518.x = 0.0;
  local_518.y = 0.0;
  bVar1 = ParseValue<tinyusdz::value::normal3f>(&local_4e8,&local_518,err);
  if (bVar1) {
    value->z = local_518.z;
    value->x = local_518.x;
    value->y = local_518.y;
  }
  ascii::AsciiParser::~AsciiParser(&local_4e8);
  return bVar1;
}

Assistant:

bool ParseMaterialXValue(const std::string &str, T *value, std::string *err) {
  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  T val{};

  if (!ParseValue(parser, val, err)) {
    return false;
  }

  (*value) = val;
  return true;
}